

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void freeCursorConstraints(RtreeCursor *pCsr)

{
  sqlite3_rtree_query_info *p;
  sqlite3_rtree_query_info *pInfo;
  int i;
  RtreeCursor *pCsr_local;
  
  if (pCsr->aConstraint != (RtreeConstraint *)0x0) {
    for (pInfo._4_4_ = 0; pInfo._4_4_ < pCsr->nConstraint; pInfo._4_4_ = pInfo._4_4_ + 1) {
      p = pCsr->aConstraint[pInfo._4_4_].pInfo;
      if (p != (sqlite3_rtree_query_info *)0x0) {
        if (p->xDelUser != (_func_void_void_ptr *)0x0) {
          (*p->xDelUser)(p->pUser);
        }
        sqlite3_free(p);
      }
    }
    sqlite3_free(pCsr->aConstraint);
    pCsr->aConstraint = (RtreeConstraint *)0x0;
  }
  return;
}

Assistant:

static void freeCursorConstraints(RtreeCursor *pCsr){
  if( pCsr->aConstraint ){
    int i;                        /* Used to iterate through constraint array */
    for(i=0; i<pCsr->nConstraint; i++){
      sqlite3_rtree_query_info *pInfo = pCsr->aConstraint[i].pInfo;
      if( pInfo ){
        if( pInfo->xDelUser ) pInfo->xDelUser(pInfo->pUser);
        sqlite3_free(pInfo);
      }
    }
    sqlite3_free(pCsr->aConstraint);
    pCsr->aConstraint = 0;
  }
}